

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void __thiscall AMColorset::initFromColors(AMColorset *this,uchar *colors,bool showlocks)

{
  int local_24;
  int local_20;
  int j;
  int i;
  bool showlocks_local;
  uchar *colors_local;
  AMColorset *this_local;
  
  local_24 = 0;
  for (local_20 = 0; local_20 < 0x18; local_20 = local_20 + 1) {
    if (((colors[local_24] == '\x01') && (colors[local_24 + 1] == '\0')) &&
       (colors[local_24 + 2] == '\0')) {
      AMColor::setInvalid(this->c + local_20);
    }
    else {
      AMColor::FromRGB(this->c + local_20,(uint)colors[local_24],(uint)colors[local_24 + 1],
                       (uint)colors[local_24 + 2]);
    }
    local_24 = local_24 + 3;
  }
  this->displayLocks = showlocks;
  this->forcebackground = false;
  return;
}

Assistant:

void initFromColors(const unsigned char *colors, bool showlocks)
	{
		for(int i=0, j=0; i<AM_NUM_COLORS; i++, j+=3)
		{
			if (colors[j] == 1 && colors[j+1] == 0 && colors[j+2] == 0)
			{
				c[i].setInvalid();
			}
			else
			{
				c[i].FromRGB(colors[j], colors[j+1], colors[j+2]);
			}
		}
		displayLocks = showlocks;
		forcebackground = false;
	}